

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TriangleDerivateCase::~TriangleDerivateCase(TriangleDerivateCase *this)

{
  TriangleDerivateCase *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleDerivateCase_015a9c00;
  tcu::TestNode::deinit((TestNode *)this);
  std::__cxx11::string::~string((string *)&this->m_fragmentSrc);
  TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TriangleDerivateCase::~TriangleDerivateCase (void)
{
	TriangleDerivateCase::deinit();
}